

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testselectionwidget.cpp
# Opt level: O1

void Undo_Redo_Selective(Am_Slot_Key allowed_slot,Am_Slot_Key method_slot,char *prompt_str)

{
  Am_Handler_Selective_Repeat_New_Method_Type *pAVar1;
  Am_Selective_New_Allowed_Method_Type *pAVar2;
  Am_Selective_Allowed_Method_Type *pAVar3;
  char cVar4;
  bool bVar5;
  Am_Value *pAVar6;
  ostream *poVar7;
  size_t sVar8;
  long *plVar9;
  anon_union_8_8_ea4c8939_for_value aVar10;
  char *pcVar11;
  Am_Object this;
  anon_union_8_8_ea4c8939_for_value in_R8;
  anon_union_8_8_ea4c8939_for_value in_R9;
  int iVar12;
  Am_Value AVar13;
  Am_Value AVar14;
  Am_Value AVar15;
  Am_Value AVar16;
  Am_Value AVar17;
  Am_Value AVar18;
  Am_Object cmd;
  int which;
  Am_Object new_cmd;
  Am_Value_List l;
  Am_String s;
  Am_Handler_Selective_Undo_Method method;
  Am_Value current_selection;
  Am_Value obj_modified;
  Am_Object last_command;
  Am_Selective_New_Allowed_Method new_allowed_method;
  Am_Selective_Allowed_Method allowed_method;
  Am_Object local_148;
  Am_Object local_140;
  int local_134;
  Am_Object local_130;
  uint local_124;
  Am_Value_List local_120 [16];
  Am_String local_110;
  Am_Handler_Selective_Repeat_New_Method local_108;
  char *local_f8;
  Am_Object local_f0;
  Am_Object local_e8;
  Am_Object local_e0;
  Am_Object local_d8;
  Am_Value local_d0;
  Am_Object local_c0;
  Am_Object local_b8;
  Am_Value local_b0;
  Am_Object local_a0;
  Am_Value local_98;
  Am_Value local_88;
  Am_Selective_New_Allowed_Method local_78;
  Am_Selective_Allowed_Method local_68;
  undefined1 local_50 [16];
  Am_Value local_40;
  
  local_a0.data = (Am_Object_Data *)0x0;
  local_f8 = prompt_str;
  Am_Value_List::Am_Value_List(local_120);
  pAVar6 = (Am_Value *)Am_Object::Get(0x5690,0xc5);
  Am_Value_List::operator=(local_120,pAVar6);
  aVar10.long_value._2_6_ = 0;
  aVar10.long_value._0_2_ = method_slot;
  local_110.data = (Am_String_Data *)0x0;
  local_148.data = (Am_Object_Data *)0x0;
  local_130.data = (Am_Object_Data *)0x0;
  local_68.from_wrapper = (Am_Method_Wrapper *)0x0;
  local_68.Call = (Am_Selective_Allowed_Method_Type *)0x0;
  local_78.from_wrapper = (Am_Method_Wrapper *)0x0;
  local_78.Call = (Am_Selective_New_Allowed_Method_Type *)0x0;
  local_d0.type = 0;
  local_d0.value.wrapper_value = (Am_Wrapper *)0x0;
  local_b0.type = 0;
  local_b0.value.wrapper_value = (Am_Wrapper *)0x0;
  local_124 = (uint)method_slot;
  if (local_124 == 0x14a) {
    pAVar6 = (Am_Value *)Am_Object::Get(0x5690,(ulong)allowed_slot);
    Am_Selective_New_Allowed_Method::operator=(&local_78,pAVar6);
    pAVar6 = (Am_Value *)Am_Object::Get(0x5698,0x169);
    Am_Value::operator=(&local_d0,pAVar6);
  }
  else {
    pAVar6 = (Am_Value *)Am_Object::Get(0x5690,(ulong)allowed_slot);
    Am_Selective_Allowed_Method::operator=(&local_68,pAVar6);
  }
  Am_Value_List::Start();
  iVar12 = 0;
  while( true ) {
    cVar4 = Am_Value_List::Last();
    if (cVar4 != '\0') break;
    pAVar6 = (Am_Value *)Am_Value_List::Get();
    Am_Object::operator=(&local_148,pAVar6);
    pAVar6 = (Am_Value *)Am_Object::Get((ushort)&local_148,0x150);
    Am_String::operator=(&local_110,pAVar6);
    pAVar6 = (Am_Value *)Am_Object::Get((ushort)&local_148,0x16d);
    Am_Value::operator=(&local_b0,pAVar6);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    poVar7 = (ostream *)operator<<(poVar7,&local_110);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," on ",4);
    poVar7 = (ostream *)operator<<(poVar7,&local_b0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (cmd = ",8);
    poVar7 = (ostream *)operator<<(poVar7,&local_148);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,") ",2);
    pAVar3 = local_68.Call;
    pAVar2 = local_78.Call;
    if (local_124 == 0x14a) {
      Am_Object::Am_Object(&local_b8,&local_148);
      Am_Value::Am_Value(&local_40,&local_d0);
      Am_Value::Am_Value((Am_Value *)local_50,(Am_Value *)&Am_No_Value);
      this.data = (Am_Object_Data *)&local_b8;
      AVar13.value.wrapper_value = (Am_Wrapper *)local_50;
      AVar13._0_8_ = &local_40;
      AVar14.value.wrapper_value = in_R8.wrapper_value;
      AVar14._0_8_ = aVar10.wrapper_value;
      bVar5 = (*pAVar2)(this,AVar13,AVar14);
      Am_Value::~Am_Value((Am_Value *)local_50);
      Am_Value::~Am_Value(&local_40);
    }
    else {
      Am_Object::Am_Object(&local_c0,&local_148);
      this.data = (Am_Object_Data *)&local_c0;
      bVar5 = (*pAVar3)(this);
    }
    Am_Object::~Am_Object((Am_Object *)this.data);
    pcVar11 = "NOT OK\n";
    if (bVar5 != false) {
      pcVar11 = "OK\n";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,pcVar11,(ulong)(bVar5 ^ 1) * 4 + 3);
    Am_Value_List::Next();
    iVar12 = iVar12 + 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--Type index of command to ",0x1b);
  pcVar11 = local_f8;
  if (local_f8 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x116520);
  }
  else {
    sVar8 = strlen(local_f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar11,sVar8);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," (or -1 to exit): ",0x12);
  std::ostream::flush();
  std::istream::operator>>((istream *)&std::cin,&local_134);
  if (-1 < local_134) {
    Am_Value_List::Start();
    if (0 < local_134) {
      iVar12 = 0;
      do {
        Am_Value_List::Next();
        iVar12 = iVar12 + 1;
      } while (iVar12 < local_134);
    }
    pAVar6 = (Am_Value *)Am_Value_List::Get();
    Am_Object::operator=(&local_148,pAVar6);
    if (local_124 == 0x14a) {
      local_108.from_wrapper = (Am_Method_Wrapper *)0x0;
      local_108.Call = (Am_Handler_Selective_Repeat_New_Method_Type *)0x0;
      pAVar6 = (Am_Value *)Am_Object::Get(0x5690,(ulong)local_124);
      Am_Handler_Selective_Repeat_New_Method::operator=(&local_108,pAVar6);
      pcVar11 = local_f8;
      if (local_f8 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x116520);
      }
      else {
        sVar8 = strlen(local_f8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar11,sVar8);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," on cmd ",8);
      poVar7 = (ostream *)operator<<((ostream *)&std::cout,&local_148);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," method = ",10);
      poVar7 = (ostream *)operator<<(poVar7,&local_108);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," new obj = ",0xb);
      plVar9 = (long *)operator<<(poVar7,&local_d0);
      std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
      std::ostream::put((char)plVar9);
      std::ostream::flush();
      std::ostream::flush();
      pAVar1 = local_108.Call;
      Am_Object::Am_Object(&local_d8,&undo_handler);
      Am_Object::Am_Object(&local_e0,&local_148);
      Am_Value::Am_Value(&local_88,&local_d0);
      Am_Value::Am_Value(&local_98,(Am_Value *)&Am_No_Value);
      AVar15.value.wrapper_value = (Am_Wrapper *)&local_88;
      AVar15._0_8_ = &local_e0;
      AVar17.value.wrapper_value = in_R9.wrapper_value;
      AVar17._0_8_ = &local_98;
      (*pAVar1)((Am_Object_Data *)&local_140,(Am_Object_Data *)&local_d8,AVar15,AVar17);
      Am_Object::operator=(&local_130,&local_140);
      Am_Object::~Am_Object(&local_140);
      Am_Value::~Am_Value(&local_98);
      Am_Value::~Am_Value(&local_88);
      Am_Object::~Am_Object(&local_e0);
      Am_Object::~Am_Object(&local_d8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  new_cmd = ",0xc);
      plVar9 = (long *)operator<<((ostream *)&std::cout,&local_130);
      std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
      std::ostream::put((char)plVar9);
      std::ostream::flush();
      std::ostream::flush();
    }
    else {
      local_108.from_wrapper = (Am_Method_Wrapper *)0x0;
      local_108.Call = (Am_Handler_Selective_Repeat_New_Method_Type *)0x0;
      pAVar6 = (Am_Value *)Am_Object::Get(0x5690,(ulong)local_124);
      Am_Handler_Selective_Undo_Method::operator=
                ((Am_Handler_Selective_Undo_Method *)&local_108,pAVar6);
      pcVar11 = local_f8;
      if (local_f8 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x116520);
      }
      else {
        sVar8 = strlen(local_f8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar11,sVar8);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," on cmd ",8);
      poVar7 = (ostream *)operator<<((ostream *)&std::cout,&local_148);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," method = ",10);
      plVar9 = (long *)operator<<(poVar7,(Am_Handler_Selective_Undo_Method *)&local_108);
      std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
      std::ostream::put((char)plVar9);
      std::ostream::flush();
      std::ostream::flush();
      pAVar1 = local_108.Call;
      Am_Object::Am_Object(&local_e8,&undo_handler);
      Am_Object::Am_Object(&local_f0,&local_148);
      AVar16.value.wrapper_value = aVar10.wrapper_value;
      AVar16._0_8_ = &local_f0;
      AVar18.value.wrapper_value = in_R9.wrapper_value;
      AVar18._0_8_ = in_R8.wrapper_value;
      (*pAVar1)((Am_Object_Data *)&local_140,(Am_Object_Data *)&local_e8,AVar16,AVar18);
      Am_Object::operator=(&local_130,&local_140);
      Am_Object::~Am_Object(&local_140);
      Am_Object::~Am_Object(&local_f0);
      Am_Object::~Am_Object(&local_e8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  new_cmd = ",0xc);
      plVar9 = (long *)operator<<((ostream *)&std::cout,&local_130);
      std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
      std::ostream::put((char)plVar9);
      std::ostream::flush();
      std::ostream::flush();
    }
  }
  Am_Value::~Am_Value(&local_b0);
  Am_Value::~Am_Value(&local_d0);
  Am_Object::~Am_Object(&local_130);
  Am_Object::~Am_Object(&local_148);
  Am_String::~Am_String(&local_110);
  Am_Value_List::~Am_Value_List(local_120);
  Am_Object::~Am_Object(&local_a0);
  return;
}

Assistant:

void
Undo_Redo_Selective(Am_Slot_Key allowed_slot, Am_Slot_Key method_slot,
                    const char *prompt_str)
{
  Am_Object last_command;
  bool use_new = (method_slot == Am_SELECTIVE_REPEAT_ON_NEW_METHOD);
  Am_Value_List l;
  l = undo_handler.Get(Am_COMMAND);
  Am_String s;
  Am_Object cmd, new_cmd;
  Am_Selective_Allowed_Method allowed_method;
  Am_Selective_New_Allowed_Method new_allowed_method;
  Am_Value current_selection, obj_modified;
  if (use_new) {
    new_allowed_method = undo_handler.Get(allowed_slot);
    //get the selection
    current_selection = my_selection.Peek(Am_VALUE);
  } else
    allowed_method = undo_handler.Get(allowed_slot);

  bool allowed;
  int cnt;
  for (l.Start(), cnt = 0; !l.Last(); l.Next(), cnt++) {
    cmd = l.Get();
    s = cmd.Get(Am_LABEL);
    obj_modified = cmd.Peek(Am_OBJECT_MODIFIED);
    std::cout << cnt << " " << s << " on " << obj_modified << " (cmd = " << cmd
              << ") ";
    if (use_new)
      allowed = new_allowed_method.Call(cmd, current_selection, Am_No_Value);
    else
      allowed = allowed_method.Call(cmd);
    if (allowed)
      std::cout << "OK\n";
    else
      std::cout << "NOT OK\n";
  }
  std::cout << "--Type index of command to " << prompt_str
            << " (or -1 to exit): " << std::flush;
  int which;
  std::cin >> which;
  if (which < 0)
    return;
  for (l.Start(), cnt = 0; cnt < which; l.Next(), cnt++)
    ;
  cmd = l.Get();
  if (use_new) {
    Am_Handler_Selective_Repeat_New_Method method;
    method = undo_handler.Get(method_slot);
    std::cout << prompt_str << " on cmd " << cmd << " method = " << method
              << " new obj = " << current_selection << std::endl
              << std::flush;
    new_cmd = method.Call(undo_handler, cmd, current_selection, Am_No_Value);
    std::cout << "  new_cmd = " << new_cmd << std::endl << std::flush;
  } else {
    Am_Handler_Selective_Undo_Method method;
    method = undo_handler.Get(method_slot);
    std::cout << prompt_str << " on cmd " << cmd << " method = " << method
              << std::endl
              << std::flush;
    new_cmd = method.Call(undo_handler, cmd);
    std::cout << "  new_cmd = " << new_cmd << std::endl << std::flush;
  }
}